

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radiobox.cpp
# Opt level: O2

Element __thiscall ftxui::anon_unknown_3::RadioboxBase::Render(RadioboxBase *this)

{
  ComponentBase *this_00;
  pointer *ppsVar1;
  ComponentBase *pCVar2;
  bool bVar3;
  size_t sVar4;
  code *pcVar5;
  ComponentBase *pCVar6;
  ComponentBase *pCVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  code *pcVar8;
  ComponentBase *in_RSI;
  ulong uVar9;
  int iVar10;
  ulong i;
  Element EVar11;
  Elements elements;
  long local_1a0;
  undefined1 local_168 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  Element local_148;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  ftxui local_118 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  ftxui local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  ftxui local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_e8;
  Decorator style;
  Decorator local_b0;
  function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> local_90;
  string local_70;
  string local_50 [32];
  
  elements.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  elements.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  elements.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = ComponentBase::Focused(in_RSI);
  this_00 = in_RSI + 1;
  sVar4 = ConstStringListRef::size((ConstStringListRef *)this_00);
  std::vector<ftxui::Box,_std::allocator<ftxui::Box>_>::resize
            ((vector<ftxui::Box,_std::allocator<ftxui::Box>_> *)&in_RSI[1].parent_,sVar4);
  if (bVar3) {
    pcVar5 = focus;
  }
  else {
    pcVar5 = select;
  }
  ppsVar1 = &in_RSI[2].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_1a0 = 0;
  i = 0;
  while( true ) {
    sVar4 = ConstStringListRef::size((ConstStringListRef *)this_00);
    if (sVar4 <= i) break;
    pCVar6 = in_RSI[6].parent_;
    if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
      pCVar6 = (ComponentBase *)ppsVar1;
    }
    pCVar2 = (ComponentBase *)
             pCVar6[4].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar7 = pCVar6 + 4;
    if (pCVar2 != (ComponentBase *)0x0) {
      pCVar7 = pCVar2;
    }
    iVar10 = (int)i;
    uVar9 = (ulong)(iVar10 != *(int *)&pCVar7->_vptr_ComponentBase) << 5 | 0x40;
    if (!bVar3) {
      uVar9 = 0x60;
    }
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&style,(function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)> *)
                      ((long)&pCVar6->_vptr_ComponentBase + uVar9));
    pCVar6 = in_RSI[6].parent_;
    if (in_RSI[6].parent_ == (ComponentBase *)0x0) {
      pCVar6 = (ComponentBase *)ppsVar1;
    }
    pCVar2 = (ComponentBase *)
             pCVar6[4].children_.
             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar7 = pCVar6 + 4;
    if (pCVar2 != (ComponentBase *)0x0) {
      pCVar7 = pCVar2;
    }
    pcVar8 = pcVar5;
    if (iVar10 != *(int *)&pCVar7->_vptr_ComponentBase) {
      pcVar8 = nothing;
    }
    std::__cxx11::string::string
              (local_50,(string *)
                        (&pCVar6->_vptr_ComponentBase +
                        (ulong)(iVar10 !=
                               *(int *)&((in_RSI[1].children_.
                                          super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                        super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr) * 4));
    text((string *)(local_168 + 0x10));
    ConstStringListRef::operator[][abi_cxx11_(&local_70,(ConstStringListRef *)this_00,i);
    text((string *)local_168);
    std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::function
              (&local_90,&style);
    operator|(local_118,(Element *)local_168,&local_90);
    hbox<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
              (local_108,(shared_ptr<ftxui::Node> *)(local_168 + 0x10),
               (shared_ptr<ftxui::Node> *)local_118);
    local_138._8_8_ = 0;
    local_120 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                ::_M_invoke;
    local_128 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                ::_M_manager;
    local_138._M_unused._M_function_pointer = pcVar8;
    operator|((ftxui *)&local_148,(Element *)local_108,(Decorator *)&local_138);
    reflect((Box *)((long)&(in_RSI[1].parent_)->_vptr_ComponentBase + local_1a0));
    operator|(local_f8,&local_148,&local_b0);
    std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>::
    emplace_back<std::shared_ptr<ftxui::Node>>
              ((vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>> *)
               &elements,(shared_ptr<ftxui::Node> *)local_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
    std::_Function_base::~_Function_base(&local_b0.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_148.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::_Function_base::~_Function_base((_Function_base *)&local_138);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
    std::_Function_base::~_Function_base(&local_90.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8));
    std::__cxx11::string::~string((string *)&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150);
    std::__cxx11::string::~string(local_50);
    std::_Function_base::~_Function_base(&style.super__Function_base);
    i = i + 1;
    local_1a0 = local_1a0 + 0x10;
  }
  local_e8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       elements.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       elements.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_e8.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       elements.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  elements.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  elements.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  elements.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vbox((Elements *)this);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_e8);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&elements);
  EVar11.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar11.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar11.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    Elements elements;
    bool is_focused = Focused();
    boxes_.resize(entries_.size());
    for (size_t i = 0; i < entries_.size(); ++i) {
      auto style = (focused_entry() == int(i) && is_focused)
                       ? option_->style_focused
                       : option_->style_unfocused;
      auto focus_management = (focused_entry() != int(i)) ? nothing
                              : is_focused                ? focus
                                                          : select;

      const std::string& symbol = *selected_ == int(i)
                                      ? option_->style_checked
                                      : option_->style_unchecked;
      elements.push_back(hbox(text(symbol), text(entries_[i]) | style) |
                         focus_management | reflect(boxes_[i]));
    }
    return vbox(std::move(elements));
  }